

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O3

bool isloggedin(bool echo)

{
  int iVar1;
  undefined4 extraout_var;
  int in_EDX;
  char local_18 [8];
  
  builtin_strncpy(local_18,"Ԋ\x19",4);
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  iVar1 = hashtable<char_*,_int>::access(&irc.IRCusers,local_18,in_EDX);
  if (echo && CONCAT44(extraout_var,iVar1) == 0) {
    ircBot::notice(&irc,irc.msg.nick,"Error: Insufficient Permission");
  }
  return CONCAT44(extraout_var,iVar1) != 0;
}

Assistant:

bool isloggedin(bool echo)
{
    /*for(int i = 0; i < irc.IRCusers.size(); i++)
    {
            if(!strcmp(irc.IRCusers[i], irc.lastmsg()->host))
                return true;
    }*/
    if(irc.IRCusers.access(irc.lastmsg()->host))
        return true;
    if(echo)
        irc.notice(irc.lastmsg()->nick, "Error: Insufficient Permission");
    return false;
}